

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  char *pcVar2;
  nn_fsm_fn p_Var3;
  ulong uVar4;
  undefined8 uVar5;
  
  uVar4 = (ulong)(uint)src;
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (type == 1) {
        nn_list_erase((nn_list *)&self[3].owner,(nn_list_item *)((long)srcptr + 0x78));
        nn_ep_term((nn_ep *)srcptr);
        nn_free(srcptr);
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar4 = 1;
      uVar5 = 0x3d4;
    }
    else {
      if (src != -2) {
        if (type == 0x84c4) {
          p_Var3 = self[1].shutdown_fn;
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var3 + 0x28);
        }
        else {
          if (type != 0x84c3) {
            nn_backtrace_print();
            uVar1 = (ulong)*(uint *)&self[1].fn;
            pcVar2 = "Unexpected action";
            uVar5 = 0x3e4;
            goto LAB_001a4013;
          }
          p_Var3 = self[1].shutdown_fn;
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var3 + 0x20);
        }
        (*UNRECOVERED_JUMPTABLE)(p_Var3,srcptr);
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0x3c4;
    }
  }
  else if (*(int *)&self[1].fn == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0x3b4;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar5 = 0x3b8;
    }
  }
  else {
    nn_backtrace_print();
    uVar1 = (ulong)*(uint *)&self[1].fn;
    pcVar2 = "Unexpected state";
    uVar5 = 0x3ec;
  }
LAB_001a4013:
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar4,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
          ,uVar5);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sock_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    switch (sock->state) {

/******************************************************************************/
/*  INIT state.                                                               */
/******************************************************************************/
    case NN_SOCK_STATE_INIT:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sock->state = NN_SOCK_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:
            nn_fsm_bad_source (sock->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        case NN_SOCK_SRC_EP:
            switch (type) {
            case NN_EP_STOPPED:

                /*  This happens when an endpoint is closed using
                    nn_shutdown() function. */
                ep = (struct nn_ep*) srcptr;
                nn_list_erase (&sock->sdeps, &ep->item);
                nn_ep_term (ep);
                nn_free (ep);
                return;

            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:

            /*  The assumption is that all the other events come from pipes. */
            switch (type) {
            case NN_PIPE_IN:
                sock->sockbase->vfptr->in (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            case NN_PIPE_OUT:
                sock->sockbase->vfptr->out (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sock->state, src, type);
    }
}